

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O2

_Bool is_valid_pf(player *p,loc grid,_Bool only_known,_Bool forbid_traps)

{
  _Bool _Var1;
  
  _Var1 = square_isknown((chunk_conflict *)p->cave,grid);
  if (!_Var1) {
    return !only_known;
  }
  _Var1 = square_isdamaging((chunk_conflict *)p->cave,grid);
  if (((_Var1) || (_Var1 = square_isfall((chunk_conflict *)p->cave,grid), _Var1)) ||
     ((forbid_traps &&
      ((_Var1 = square_isvisibletrap((chunk_conflict *)p->cave,grid), _Var1 &&
       (_Var1 = player_is_trapsafe(p), !_Var1)))))) {
    return false;
  }
  _Var1 = square_ispassable((chunk_conflict *)p->cave,grid);
  if (_Var1) {
    return true;
  }
  _Var1 = square_iscloseddoor((chunk_conflict *)p->cave,grid);
  if (_Var1) {
    return true;
  }
  _Var1 = square_isrubble((chunk_conflict *)p->cave,grid);
  return _Var1;
}

Assistant:

static bool is_valid_pf(struct player *p, struct loc grid, bool only_known,
		bool forbid_traps)
{
	/*
	 * If only_known is true, do not want to consider unremembered squares;
	 * otherwise, they are acceptable.
	 */
	if (!square_isknown(p->cave, grid)) return !only_known;

	/*
	 * For all remaining tests, use the player's memory of what's there
	 * to avoid leaking information if the terrain has changed.
	 */
	/* No damaging terrain or empty space */
	if (square_isdamaging(p->cave, grid) || square_isfall(p->cave, grid)) {
		return false;
	}

	/* No trapped squares if forbidding traps unless trapsafe */
	if (forbid_traps && square_isvisibletrap(p->cave, grid)
			&& !player_is_trapsafe(p)) {
		return false;
	}

	/* All remaining passable terrain is okay. */
	if (square_ispassable(p->cave, grid)) {
		return true;
	}

	/*
	 * Some impassable terrain can be traversed fairly easily by modifying
	 * the terrain so allow those kinds.
	 */
	if (square_iscloseddoor(p->cave, grid)
			|| square_isrubble(p->cave, grid)) {
		return true;
	}

	/* Reject all other impassable terrain. */
	return false;
}